

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O1

void __thiscall APowerFlight::EndEffect(APowerFlight *this)

{
  double *pdVar1;
  ActorFlags2 *pAVar2;
  ActorFlags *pAVar3;
  double dVar4;
  AActor *pAVar5;
  
  APowerup::EndEffect(&this->super_APowerup);
  pAVar5 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  if (pAVar5 != (AActor *)0x0) {
    if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if ((((this->super_APowerup).super_AInventory.Owner.field_0.p)->player != (player_t *)0x0) &&
         (((((this->super_APowerup).super_AInventory.Owner.field_0.p)->flags7).Value & 0x20000) == 0
         )) {
        pAVar5 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
        dVar4 = (pAVar5->__Pos).Z;
        pdVar1 = &pAVar5->floorz;
        if ((dVar4 != *pdVar1) || (NAN(dVar4) || NAN(*pdVar1))) {
          ((this->super_APowerup).super_AInventory.Owner.field_0.p)->player->centering = true;
        }
        pAVar2 = &((this->super_APowerup).super_AInventory.Owner.field_0.p)->flags2;
        pAVar2->Value = pAVar2->Value & 0xffffffef;
        pAVar3 = &((this->super_APowerup).super_AInventory.Owner.field_0.p)->flags;
        pAVar3->Value = pAVar3->Value & 0xfffffdff;
      }
    }
    else {
      (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
    }
  }
  return;
}

Assistant:

void APowerFlight::EndEffect ()
{
	Super::EndEffect();
	if (Owner == NULL || Owner->player == NULL)
	{
		return;
	}

	if (!(Owner->flags7 & MF7_FLYCHEAT))
	{
		if (Owner->Z() != Owner->floorz)
		{
			Owner->player->centering = true;
		}
		Owner->flags2 &= ~MF2_FLY;
		Owner->flags &= ~MF_NOGRAVITY;
	}
//	BorderTopRefresh = screen->GetPageCount (); //make sure the sprite's cleared out
}